

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::argument_loader<Job*,std::__cxx11::string_const&>::load_impl_sequence<0ul,1ul>
          (argument_loader<Job*,std::__cxx11::string_const&> *this,long src)

{
  bool bVar1;
  bool bVar2;
  
  if ((*(byte *)(*(long *)(src + 8) + 0xab) & 4) != 0) {
    bVar1 = type_caster_generic::load
                      ((type_caster_generic *)(this + 0x28),*(PyObject **)(src + 0x18),true);
    if ((*(byte *)(*(long *)(src + 8) + 0xab) & 4) != 0) {
      bVar2 = type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
              ::load((type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                      *)this,*(PyObject **)(src + 0x20),true);
      return bVar2 && bVar1;
    }
  }
  __assert_fail("PyTuple_Check(src.ptr())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/cast.h"
                ,0x4f5,
                "bool pybind11::detail::argument_loader<Job *, const std::basic_string<char> &>::load_impl_sequence(handle, index_sequence<Is...>) [Args = <Job *, const std::basic_string<char> &>, Is = <0UL, 1UL>]"
               );
}

Assistant:

bool load_impl_sequence(handle src, index_sequence<Is...>) {
        for (bool r : {std::get<Is>(value).load(PyTuple_GET_ITEM(src.ptr(), Is), true)...})
            if (!r)
                return false;
        return true;
    }